

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O0

QString * __thiscall QTlsBackend::shortNameForId(QTlsBackend *this,int cid)

{
  bool bVar1;
  QDebug *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff68;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_ffffffffffffff70;
  int line;
  QMessageLogger *this_00;
  undefined1 local_58 [16];
  char *in_stack_ffffffffffffffb8;
  QDebug local_20;
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QtPrivateLogging::lcSsl();
  anon_unknown.dwarf_4f207b::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  while( true ) {
    line = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_4f207b::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x277957);
    QMessageLogger::QMessageLogger
              (this_00,(char *)in_RDI,line,(char *)in_stack_ffffffffffffff68,(char *)0x27796d);
    QMessageLogger::warning();
    in_stack_ffffffffffffff70 =
         (QLoggingCategoryMacroHolder<(QtMsgType)1> *)
         QDebug::operator<<(in_RSI,in_stack_ffffffffffffffb8);
    (**(code **)(in_RSI->stream + 0x90))(local_58);
    QDebug::operator<<((QDebug *)this_00,(QString *)in_RDI);
    QDebug::operator<<(in_RSI,in_stack_ffffffffffffffb8);
    QString::~QString((QString *)0x2779cd);
    QDebug::~QDebug(&local_20);
    local_10 = 0;
  }
  QString::QString((QString *)0x2779ee);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QTlsBackend::shortNameForId(int cid) const
{
    Q_UNUSED(cid);
    REPORT_MISSING_SUPPORT("does not support QSslEllipticCurve");
    return {};
}